

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O2

void __thiscall
KosarajuSCC::fillOrder
          (KosarajuSCC *this,int v,bool *visited,
          stack<int,_std::deque<int,_std::allocator<int>_>_> *s)

{
  uint uVar1;
  pointer pvVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  value_type_conflict1 local_34;
  
  visited[v] = true;
  uVar5 = 0;
  while( true ) {
    pvVar2 = (this->outgoing).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = *(long *)&pvVar2[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)pvVar2[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - lVar3 >> 2) <= (ulong)uVar5) break;
    uVar1 = *(uint *)(lVar3 + (ulong)uVar5 * 4);
    iVar4 = (*this->_vptr_KosarajuSCC[2])(this,(ulong)uVar1);
    if ((char)iVar4 == '\0') {
      uVar1 = *(uint *)(*(long *)&(this->ends).
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(int)uVar1].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data + 4);
      iVar4 = (*this->_vptr_KosarajuSCC[3])(this,(ulong)uVar1);
      if (((char)iVar4 == '\0') && (visited[(int)uVar1] == false)) {
        fillOrder(this,uVar1,visited,s);
      }
    }
    uVar5 = uVar5 + 1;
  }
  std::deque<int,_std::allocator<int>_>::push_back(&s->c,&local_34);
  return;
}

Assistant:

void KosarajuSCC::fillOrder(int v, bool visited[], std::stack<int>& s) {
	// Mark the current node as visited and print it
	visited[v] = true;
	// Recur for all the vertices adjacent to this vertex
	for (unsigned int i = 0; i < outgoing[v].size(); ++i) {
		const int e = outgoing[v][i];
		if (ignore_edge(e)) {
			continue;
		}
		const int u = ends[e][1];
		if (ignore_node(u)) {
			continue;
		}
		if (!visited[u]) {
			fillOrder(u, visited, s);
		}
	}

	// All vertices reachable from v are processed by now, push v
	s.push(v);
}